

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<unsigned_long,char[3],char[5]>
          (Capturer *this,size_t index,unsigned_long *value,char (*values) [3],char (*values_1) [5])

{
  string local_50;
  char (*local_30) [5];
  char (*values_local_1) [5];
  char (*values_local) [3];
  unsigned_long *value_local;
  size_t index_local;
  Capturer *this_local;
  
  local_30 = values_1;
  values_local_1 = (char (*) [5])values;
  values_local = (char (*) [3])value;
  value_local = (unsigned_long *)index;
  index_local = (size_t)this;
  Detail::stringify<unsigned_long>(&local_50,value);
  captureValue(this,index,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  captureValues<char[3],char[5]>(this,(long)value_local + 1,(char (*) [3])values_local_1,local_30);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }